

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommodoreGCR.cpp
# Opt level: O1

uint Storage::Encodings::CommodoreGCR::encoding_for_nibble(uint8_t nibble)

{
  return *(uint *)(&DAT_004e5adc + (ulong)(nibble & 0xf) * 4);
}

Assistant:

unsigned int Storage::Encodings::CommodoreGCR::encoding_for_nibble(uint8_t nibble) {
	switch(nibble & 0xf) {
		case 0x0:	return 0x0a;		case 0x1:	return 0x0b;
		case 0x2:	return 0x12;		case 0x3:	return 0x13;
		case 0x4:	return 0x0e;		case 0x5:	return 0x0f;
		case 0x6:	return 0x16;		case 0x7:	return 0x17;
		case 0x8:	return 0x09;		case 0x9:	return 0x19;
		case 0xa:	return 0x1a;		case 0xb:	return 0x1b;
		case 0xc:	return 0x0d;		case 0xd:	return 0x1d;
		case 0xe:	return 0x1e;		case 0xf:	return 0x15;

		// for the benefit of the compiler; clearly unreachable
		default:	return 0xff;
	}
}